

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_3::getNumShaderBlocks(Shader *shader,Storage storage)

{
  DefaultBlock *pDVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  int local_24;
  int local_20;
  int dimensionNdx;
  int numInstances;
  int ndx;
  int retVal;
  Storage storage_local;
  Shader *shader_local;
  
  numInstances = 0;
  dimensionNdx = 0;
  while( true ) {
    pDVar1 = ProgramInterfaceDefinition::Shader::getDefaultBlock(shader);
    sVar2 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::size
                      (&pDVar1->interfaceBlocks);
    if ((int)sVar2 <= dimensionNdx) break;
    pDVar1 = ProgramInterfaceDefinition::Shader::getDefaultBlock(shader);
    pvVar3 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::operator[]
                       (&pDVar1->interfaceBlocks,(long)dimensionNdx);
    if (pvVar3->storage == storage) {
      local_20 = 1;
      local_24 = 0;
      while( true ) {
        pDVar1 = ProgramInterfaceDefinition::Shader::getDefaultBlock(shader);
        pvVar3 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::operator[]
                           (&pDVar1->interfaceBlocks,(long)dimensionNdx);
        sVar2 = std::vector<int,_std::allocator<int>_>::size(&pvVar3->dimensions);
        if ((int)sVar2 <= local_24) break;
        pDVar1 = ProgramInterfaceDefinition::Shader::getDefaultBlock(shader);
        pvVar3 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::operator[]
                           (&pDVar1->interfaceBlocks,(long)dimensionNdx);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&pvVar3->dimensions,(long)local_24);
        local_20 = *pvVar4 * local_20;
        local_24 = local_24 + 1;
      }
      numInstances = local_20 + numInstances;
    }
    dimensionNdx = dimensionNdx + 1;
  }
  return numInstances;
}

Assistant:

static int getNumShaderBlocks (const ProgramInterfaceDefinition::Shader* shader, glu::Storage storage)
{
	int retVal = 0;

	for (int ndx = 0; ndx < (int)shader->getDefaultBlock().interfaceBlocks.size(); ++ndx)
	{
		if (shader->getDefaultBlock().interfaceBlocks[ndx].storage == storage)
		{
			int numInstances = 1;

			for (int dimensionNdx = 0; dimensionNdx < (int)shader->getDefaultBlock().interfaceBlocks[ndx].dimensions.size(); ++dimensionNdx)
				numInstances *= shader->getDefaultBlock().interfaceBlocks[ndx].dimensions[dimensionNdx];

			retVal += numInstances;
		}
	}

	return retVal;
}